

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void __thiscall cfd::core::ExtPubkey::ExtPubkey(ExtPubkey *this)

{
  ByteData::ByteData(&this->serialize_data_);
  this->child_num_ = 0;
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  ByteData256::ByteData256(&this->chaincode_);
  Pubkey::Pubkey(&this->pubkey_);
  ByteData256::ByteData256(&this->tweak_sum_);
  return;
}

Assistant:

ExtPubkey::ExtPubkey() {
  // do nothing
}